

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::WeightParams::MergeFrom(WeightParams *this,WeightParams *from)

{
  ulong uVar1;
  LogMessage *other;
  QuantizationParams *this_00;
  undefined8 *puVar2;
  ulong uVar3;
  undefined1 *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x57a0);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::RepeatedField<float>::MergeFrom(&this->floatvalue_,&from->floatvalue_);
  uVar3 = (ulong)(from->float16value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->float16value_,uVar3,puVar2);
  }
  uVar3 = (ulong)(from->rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->rawvalue_,uVar3,puVar2);
  }
  uVar3 = (ulong)(from->int8rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->int8rawvalue_,uVar3,puVar2);
  }
  if ((from != (WeightParams *)_WeightParams_default_instance_) &&
     (from->quantization_ != (QuantizationParams *)0x0)) {
    this_00 = _internal_mutable_quantization(this);
    from_00 = (undefined1 *)from->quantization_;
    if ((QuantizationParams *)from_00 == (QuantizationParams *)0x0) {
      from_00 = _QuantizationParams_default_instance_;
    }
    QuantizationParams::MergeFrom(this_00,(QuantizationParams *)from_00);
  }
  if (from->isupdatable_ == true) {
    this->isupdatable_ = true;
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void WeightParams::MergeFrom(const WeightParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.WeightParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  floatvalue_.MergeFrom(from.floatvalue_);
  if (!from._internal_float16value().empty()) {
    _internal_set_float16value(from._internal_float16value());
  }
  if (!from._internal_rawvalue().empty()) {
    _internal_set_rawvalue(from._internal_rawvalue());
  }
  if (!from._internal_int8rawvalue().empty()) {
    _internal_set_int8rawvalue(from._internal_int8rawvalue());
  }
  if (from._internal_has_quantization()) {
    _internal_mutable_quantization()->::CoreML::Specification::QuantizationParams::MergeFrom(from._internal_quantization());
  }
  if (from._internal_isupdatable() != 0) {
    _internal_set_isupdatable(from._internal_isupdatable());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}